

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O2

void proto3_unittest::TestHasbits::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint32_t *puVar1;
  uint uVar2;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  intptr_t iVar3;
  char *failure_msg;
  void *pvVar4;
  int line;
  Arena *arena;
  TestHasbits *_this;
  TestHasbits *local_28;
  LogMessageFatal local_20;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_28 = (TestHasbits *)to_msg;
  local_20.super_LogMessage._0_8_ = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto3_unittest::TestHasbits_const*,proto3_unittest::TestHasbits*>
                          ((TestHasbits **)&local_20,&local_28,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar2 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((char)uVar2 != '\0') {
      if (((uVar2 & 1) != 0) && (*(char *)&from_msg[2]._vptr_MessageLite == '\x01')) {
        *(undefined1 *)((long)&local_28->field_0 + 0x10) = 1;
      }
      if (((uVar2 & 2) != 0) && (*(char *)((long)&from_msg[2]._vptr_MessageLite + 1) == '\x01')) {
        (local_28->field_0)._impl_.b2_ = true;
      }
      if (((uVar2 & 4) != 0) && (*(char *)((long)&from_msg[2]._vptr_MessageLite + 2) == '\x01')) {
        (local_28->field_0)._impl_.b3_ = true;
      }
      if (((uVar2 & 8) != 0) && (*(char *)((long)&from_msg[2]._vptr_MessageLite + 3) == '\x01')) {
        (local_28->field_0)._impl_.b4_ = true;
      }
      if (((uVar2 & 0x10) != 0) && (*(char *)((long)&from_msg[2]._vptr_MessageLite + 4) == '\x01'))
      {
        (local_28->field_0)._impl_.b5_ = true;
      }
      if (((uVar2 & 0x20) != 0) && (*(char *)((long)&from_msg[2]._vptr_MessageLite + 5) == '\x01'))
      {
        (local_28->field_0)._impl_.b6_ = true;
      }
      if (((uVar2 & 0x40) != 0) && (*(char *)((long)&from_msg[2]._vptr_MessageLite + 6) == '\x01'))
      {
        (local_28->field_0)._impl_.b7_ = true;
      }
      if (((char)uVar2 < '\0') && (*(char *)((long)&from_msg[2]._vptr_MessageLite + 7) == '\x01')) {
        (local_28->field_0)._impl_.b8_ = true;
      }
    }
    if ((uVar2 & 0xff00) != 0) {
      if (((uVar2 >> 8 & 1) != 0) && ((char)from_msg[2]._internal_metadata_.ptr_ == '\x01')) {
        *(undefined1 *)((long)&local_28->field_0 + 0x18) = 1;
      }
      if (((uVar2 >> 9 & 1) != 0) &&
         (*(char *)((long)&from_msg[2]._internal_metadata_.ptr_ + 1) == '\x01')) {
        (local_28->field_0)._impl_.b10_ = true;
      }
      if (((uVar2 >> 10 & 1) != 0) &&
         (*(char *)((long)&from_msg[2]._internal_metadata_.ptr_ + 2) == '\x01')) {
        (local_28->field_0)._impl_.b11_ = true;
      }
      if (((uVar2 >> 0xb & 1) != 0) &&
         (*(char *)((long)&from_msg[2]._internal_metadata_.ptr_ + 3) == '\x01')) {
        (local_28->field_0)._impl_.b12_ = true;
      }
      if (((uVar2 >> 0xc & 1) != 0) &&
         (*(char *)((long)&from_msg[2]._internal_metadata_.ptr_ + 4) == '\x01')) {
        (local_28->field_0)._impl_.b13_ = true;
      }
      if (((uVar2 >> 0xd & 1) != 0) &&
         (*(char *)((long)&from_msg[2]._internal_metadata_.ptr_ + 5) == '\x01')) {
        (local_28->field_0)._impl_.b14_ = true;
      }
      if (((uVar2 >> 0xe & 1) != 0) &&
         (*(char *)((long)&from_msg[2]._internal_metadata_.ptr_ + 6) == '\x01')) {
        (local_28->field_0)._impl_.b15_ = true;
      }
      if (((short)uVar2 < 0) &&
         (*(char *)((long)&from_msg[2]._internal_metadata_.ptr_ + 7) == '\x01')) {
        (local_28->field_0)._impl_.b16_ = true;
      }
    }
    if ((uVar2 & 0xff0000) != 0) {
      if (((uVar2 >> 0x10 & 1) != 0) && (*(char *)&from_msg[3]._vptr_MessageLite == '\x01')) {
        *(undefined1 *)((long)&local_28->field_0 + 0x20) = 1;
      }
      if (((uVar2 >> 0x11 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._vptr_MessageLite + 1) == '\x01')) {
        (local_28->field_0)._impl_.b18_ = true;
      }
      if (((uVar2 >> 0x12 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._vptr_MessageLite + 2) == '\x01')) {
        (local_28->field_0)._impl_.b19_ = true;
      }
      if (((uVar2 >> 0x13 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._vptr_MessageLite + 3) == '\x01')) {
        (local_28->field_0)._impl_.b20_ = true;
      }
      if (((uVar2 >> 0x14 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._vptr_MessageLite + 4) == '\x01')) {
        (local_28->field_0)._impl_.b21_ = true;
      }
      if (((uVar2 >> 0x15 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._vptr_MessageLite + 5) == '\x01')) {
        (local_28->field_0)._impl_.b22_ = true;
      }
      if (((uVar2 >> 0x16 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._vptr_MessageLite + 6) == '\x01')) {
        (local_28->field_0)._impl_.b23_ = true;
      }
      if (((uVar2 >> 0x17 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._vptr_MessageLite + 7) == '\x01')) {
        (local_28->field_0)._impl_.b24_ = true;
      }
    }
    if (0xffffff < uVar2) {
      if (((uVar2 >> 0x18 & 1) != 0) && ((char)from_msg[3]._internal_metadata_.ptr_ == '\x01')) {
        *(undefined1 *)((long)&local_28->field_0 + 0x28) = 1;
      }
      if (((uVar2 >> 0x19 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._internal_metadata_.ptr_ + 1) == '\x01')) {
        (local_28->field_0)._impl_.b26_ = true;
      }
      if (((uVar2 >> 0x1a & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._internal_metadata_.ptr_ + 2) == '\x01')) {
        (local_28->field_0)._impl_.b27_ = true;
      }
      if (((uVar2 >> 0x1b & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._internal_metadata_.ptr_ + 3) == '\x01')) {
        (local_28->field_0)._impl_.b28_ = true;
      }
      if (((uVar2 >> 0x1c & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._internal_metadata_.ptr_ + 4) == '\x01')) {
        (local_28->field_0)._impl_.b29_ = true;
      }
      if (((uVar2 >> 0x1d & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._internal_metadata_.ptr_ + 5) == '\x01')) {
        (local_28->field_0)._impl_.b30_ = true;
      }
      if (((uVar2 >> 0x1e & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._internal_metadata_.ptr_ + 6) == '\x01')) {
        (local_28->field_0)._impl_.b31_ = true;
      }
      if ((int)uVar2 < 0) {
        from_msg_00 = (MessageLite *)from_msg[4]._vptr_MessageLite;
        if (from_msg_00 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.child_ != nullptr";
          line = 0x1d05;
          goto LAB_00a6d67e;
        }
        to_msg_00 = *(MessageLite **)((long)&local_28->field_0 + 0x30);
        if (to_msg_00 == (MessageLite *)0x0) {
          pvVar4 = google::protobuf::Arena::CopyConstruct<proto3_unittest::TestAllTypes>
                             (arena,from_msg_00);
          *(void **)((long)&local_28->field_0 + 0x30) = pvVar4;
        }
        else {
          proto3_unittest::TestAllTypes::MergeImpl(to_msg_00,from_msg_00);
        }
      }
    }
    uVar2 = *(uint *)((long)&from_msg[1]._vptr_MessageLite + 4);
    if ((char)uVar2 != '\0') {
      if (((uVar2 & 1) != 0) && ((char)from_msg[4]._internal_metadata_.ptr_ == '\x01')) {
        *(undefined1 *)((long)&local_28->field_0 + 0x38) = 1;
      }
      if (((uVar2 & 2) != 0) &&
         (*(char *)((long)&from_msg[4]._internal_metadata_.ptr_ + 1) == '\x01')) {
        (local_28->field_0)._impl_.b33_ = true;
      }
      if (((uVar2 & 4) != 0) &&
         (*(char *)((long)&from_msg[4]._internal_metadata_.ptr_ + 2) == '\x01')) {
        (local_28->field_0)._impl_.b34_ = true;
      }
      if (((uVar2 & 8) != 0) &&
         (*(char *)((long)&from_msg[4]._internal_metadata_.ptr_ + 3) == '\x01')) {
        (local_28->field_0)._impl_.b35_ = true;
      }
      if (((uVar2 & 0x10) != 0) &&
         (*(char *)((long)&from_msg[4]._internal_metadata_.ptr_ + 4) == '\x01')) {
        (local_28->field_0)._impl_.b36_ = true;
      }
      if (((uVar2 & 0x20) != 0) &&
         (*(char *)((long)&from_msg[4]._internal_metadata_.ptr_ + 5) == '\x01')) {
        (local_28->field_0)._impl_.b37_ = true;
      }
      if (((uVar2 & 0x40) != 0) &&
         (*(char *)((long)&from_msg[4]._internal_metadata_.ptr_ + 6) == '\x01')) {
        (local_28->field_0)._impl_.b38_ = true;
      }
      if (((char)uVar2 < '\0') &&
         (*(char *)((long)&from_msg[4]._internal_metadata_.ptr_ + 7) == '\x01')) {
        (local_28->field_0)._impl_.b39_ = true;
      }
    }
    if ((uVar2 & 0xff00) != 0) {
      if (((uVar2 >> 8 & 1) != 0) && (*(char *)&from_msg[5]._vptr_MessageLite == '\x01')) {
        *(undefined1 *)((long)&local_28->field_0 + 0x40) = 1;
      }
      if (((uVar2 >> 9 & 1) != 0) && (*(char *)((long)&from_msg[5]._vptr_MessageLite + 1) == '\x01')
         ) {
        (local_28->field_0)._impl_.b41_ = true;
      }
      if (((uVar2 >> 10 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._vptr_MessageLite + 2) == '\x01')) {
        (local_28->field_0)._impl_.b42_ = true;
      }
      if (((uVar2 >> 0xb & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._vptr_MessageLite + 3) == '\x01')) {
        (local_28->field_0)._impl_.b43_ = true;
      }
      if (((uVar2 >> 0xc & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._vptr_MessageLite + 4) == '\x01')) {
        (local_28->field_0)._impl_.b44_ = true;
      }
      if (((uVar2 >> 0xd & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._vptr_MessageLite + 5) == '\x01')) {
        (local_28->field_0)._impl_.b45_ = true;
      }
      if (((uVar2 >> 0xe & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._vptr_MessageLite + 6) == '\x01')) {
        (local_28->field_0)._impl_.b46_ = true;
      }
      if (((short)uVar2 < 0) && (*(char *)((long)&from_msg[5]._vptr_MessageLite + 7) == '\x01')) {
        (local_28->field_0)._impl_.b47_ = true;
      }
    }
    if ((uVar2 & 0xff0000) != 0) {
      if (((uVar2 >> 0x10 & 1) != 0) && ((char)from_msg[5]._internal_metadata_.ptr_ == '\x01')) {
        *(undefined1 *)((long)&local_28->field_0 + 0x48) = 1;
      }
      if (((uVar2 >> 0x11 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._internal_metadata_.ptr_ + 1) == '\x01')) {
        (local_28->field_0)._impl_.b49_ = true;
      }
      if (((uVar2 >> 0x12 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._internal_metadata_.ptr_ + 2) == '\x01')) {
        (local_28->field_0)._impl_.b50_ = true;
      }
      if (((uVar2 >> 0x13 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._internal_metadata_.ptr_ + 3) == '\x01')) {
        (local_28->field_0)._impl_.b51_ = true;
      }
      if (((uVar2 >> 0x14 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._internal_metadata_.ptr_ + 4) == '\x01')) {
        (local_28->field_0)._impl_.b52_ = true;
      }
      if (((uVar2 >> 0x15 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._internal_metadata_.ptr_ + 5) == '\x01')) {
        (local_28->field_0)._impl_.b53_ = true;
      }
      if (((uVar2 >> 0x16 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._internal_metadata_.ptr_ + 6) == '\x01')) {
        (local_28->field_0)._impl_.b54_ = true;
      }
      if (((uVar2 >> 0x17 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._internal_metadata_.ptr_ + 7) == '\x01')) {
        (local_28->field_0)._impl_.b55_ = true;
      }
    }
    if (0xffffff < uVar2) {
      if (((uVar2 >> 0x18 & 1) != 0) && (*(char *)&from_msg[6]._vptr_MessageLite == '\x01')) {
        *(undefined1 *)((long)&local_28->field_0 + 0x50) = 1;
      }
      if (((uVar2 >> 0x19 & 1) != 0) &&
         (*(char *)((long)&from_msg[6]._vptr_MessageLite + 1) == '\x01')) {
        (local_28->field_0)._impl_.b57_ = true;
      }
      if (((uVar2 >> 0x1a & 1) != 0) &&
         (*(char *)((long)&from_msg[6]._vptr_MessageLite + 2) == '\x01')) {
        (local_28->field_0)._impl_.b58_ = true;
      }
      if (((uVar2 >> 0x1b & 1) != 0) &&
         (*(char *)((long)&from_msg[6]._vptr_MessageLite + 3) == '\x01')) {
        (local_28->field_0)._impl_.b59_ = true;
      }
      if (((uVar2 >> 0x1c & 1) != 0) &&
         (*(char *)((long)&from_msg[6]._vptr_MessageLite + 4) == '\x01')) {
        (local_28->field_0)._impl_.b60_ = true;
      }
      if (((uVar2 >> 0x1d & 1) != 0) &&
         (*(char *)((long)&from_msg[6]._vptr_MessageLite + 5) == '\x01')) {
        (local_28->field_0)._impl_.b61_ = true;
      }
      if (((uVar2 >> 0x1e & 1) != 0) &&
         (*(char *)((long)&from_msg[6]._vptr_MessageLite + 6) == '\x01')) {
        (local_28->field_0)._impl_.b62_ = true;
      }
      if (((int)uVar2 < 0) && (*(char *)((long)&from_msg[6]._vptr_MessageLite + 7) == '\x01')) {
        (local_28->field_0)._impl_.b63_ = true;
      }
    }
    iVar3 = from_msg[1]._internal_metadata_.ptr_;
    if ((iVar3 & 0x3f) != 0) {
      if (((iVar3 & 1) != 0) && ((char)from_msg[6]._internal_metadata_.ptr_ == '\x01')) {
        *(undefined1 *)((long)&local_28->field_0 + 0x58) = 1;
      }
      if (((iVar3 & 2) != 0) &&
         (*(char *)((long)&from_msg[6]._internal_metadata_.ptr_ + 1) == '\x01')) {
        (local_28->field_0)._impl_.b65_ = true;
      }
      if (((iVar3 & 4) != 0) &&
         (*(char *)((long)&from_msg[6]._internal_metadata_.ptr_ + 2) == '\x01')) {
        (local_28->field_0)._impl_.b66_ = true;
      }
      if (((iVar3 & 8) != 0) &&
         (*(char *)((long)&from_msg[6]._internal_metadata_.ptr_ + 3) == '\x01')) {
        (local_28->field_0)._impl_.b67_ = true;
      }
      if (((iVar3 & 0x10) != 0) &&
         (*(char *)((long)&from_msg[6]._internal_metadata_.ptr_ + 4) == '\x01')) {
        (local_28->field_0)._impl_.b68_ = true;
      }
      if (((iVar3 & 0x20) != 0) &&
         (*(char *)((long)&from_msg[6]._internal_metadata_.ptr_ + 5) == '\x01')) {
        (local_28->field_0)._impl_.b69_ = true;
      }
    }
    *(ulong *)&local_28->field_0 =
         *(ulong *)&local_28->field_0 | (ulong)from_msg[1]._vptr_MessageLite;
    puVar1 = (local_28->field_0)._impl_._has_bits_.has_bits_ + 2;
    *puVar1 = *puVar1 | (uint)from_msg[1]._internal_metadata_.ptr_;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_28->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  line = 0x1c5d;
LAB_00a6d67e:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_proto3.pb.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

void TestHasbits::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestHasbits*>(&to_msg);
  auto& from = static_cast<const TestHasbits&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_unittest.TestHasbits)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (from._internal_b1() != 0) {
        _this->_impl_.b1_ = from._impl_.b1_;
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_b2() != 0) {
        _this->_impl_.b2_ = from._impl_.b2_;
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (from._internal_b3() != 0) {
        _this->_impl_.b3_ = from._impl_.b3_;
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_b4() != 0) {
        _this->_impl_.b4_ = from._impl_.b4_;
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_b5() != 0) {
        _this->_impl_.b5_ = from._impl_.b5_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_b6() != 0) {
        _this->_impl_.b6_ = from._impl_.b6_;
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (from._internal_b7() != 0) {
        _this->_impl_.b7_ = from._impl_.b7_;
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (from._internal_b8() != 0) {
        _this->_impl_.b8_ = from._impl_.b8_;
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      if (from._internal_b9() != 0) {
        _this->_impl_.b9_ = from._impl_.b9_;
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      if (from._internal_b10() != 0) {
        _this->_impl_.b10_ = from._impl_.b10_;
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (from._internal_b11() != 0) {
        _this->_impl_.b11_ = from._impl_.b11_;
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (from._internal_b12() != 0) {
        _this->_impl_.b12_ = from._impl_.b12_;
      }
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (from._internal_b13() != 0) {
        _this->_impl_.b13_ = from._impl_.b13_;
      }
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (from._internal_b14() != 0) {
        _this->_impl_.b14_ = from._impl_.b14_;
      }
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (from._internal_b15() != 0) {
        _this->_impl_.b15_ = from._impl_.b15_;
      }
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (from._internal_b16() != 0) {
        _this->_impl_.b16_ = from._impl_.b16_;
      }
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (from._internal_b17() != 0) {
        _this->_impl_.b17_ = from._impl_.b17_;
      }
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (from._internal_b18() != 0) {
        _this->_impl_.b18_ = from._impl_.b18_;
      }
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (from._internal_b19() != 0) {
        _this->_impl_.b19_ = from._impl_.b19_;
      }
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (from._internal_b20() != 0) {
        _this->_impl_.b20_ = from._impl_.b20_;
      }
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (from._internal_b21() != 0) {
        _this->_impl_.b21_ = from._impl_.b21_;
      }
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (from._internal_b22() != 0) {
        _this->_impl_.b22_ = from._impl_.b22_;
      }
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (from._internal_b23() != 0) {
        _this->_impl_.b23_ = from._impl_.b23_;
      }
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      if (from._internal_b24() != 0) {
        _this->_impl_.b24_ = from._impl_.b24_;
      }
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      if (from._internal_b25() != 0) {
        _this->_impl_.b25_ = from._impl_.b25_;
      }
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      if (from._internal_b26() != 0) {
        _this->_impl_.b26_ = from._impl_.b26_;
      }
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      if (from._internal_b27() != 0) {
        _this->_impl_.b27_ = from._impl_.b27_;
      }
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      if (from._internal_b28() != 0) {
        _this->_impl_.b28_ = from._impl_.b28_;
      }
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      if (from._internal_b29() != 0) {
        _this->_impl_.b29_ = from._impl_.b29_;
      }
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      if (from._internal_b30() != 0) {
        _this->_impl_.b30_ = from._impl_.b30_;
      }
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      if (from._internal_b31() != 0) {
        _this->_impl_.b31_ = from._impl_.b31_;
      }
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      ABSL_DCHECK(from._impl_.child_ != nullptr);
      if (_this->_impl_.child_ == nullptr) {
        _this->_impl_.child_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.child_);
      } else {
        _this->_impl_.child_->MergeFrom(*from._impl_.child_);
      }
    }
  }
  cached_has_bits = from._impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (from._internal_b32() != 0) {
        _this->_impl_.b32_ = from._impl_.b32_;
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_b33() != 0) {
        _this->_impl_.b33_ = from._impl_.b33_;
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (from._internal_b34() != 0) {
        _this->_impl_.b34_ = from._impl_.b34_;
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_b35() != 0) {
        _this->_impl_.b35_ = from._impl_.b35_;
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_b36() != 0) {
        _this->_impl_.b36_ = from._impl_.b36_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_b37() != 0) {
        _this->_impl_.b37_ = from._impl_.b37_;
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (from._internal_b38() != 0) {
        _this->_impl_.b38_ = from._impl_.b38_;
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (from._internal_b39() != 0) {
        _this->_impl_.b39_ = from._impl_.b39_;
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      if (from._internal_b40() != 0) {
        _this->_impl_.b40_ = from._impl_.b40_;
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      if (from._internal_b41() != 0) {
        _this->_impl_.b41_ = from._impl_.b41_;
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (from._internal_b42() != 0) {
        _this->_impl_.b42_ = from._impl_.b42_;
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (from._internal_b43() != 0) {
        _this->_impl_.b43_ = from._impl_.b43_;
      }
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (from._internal_b44() != 0) {
        _this->_impl_.b44_ = from._impl_.b44_;
      }
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (from._internal_b45() != 0) {
        _this->_impl_.b45_ = from._impl_.b45_;
      }
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (from._internal_b46() != 0) {
        _this->_impl_.b46_ = from._impl_.b46_;
      }
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (from._internal_b47() != 0) {
        _this->_impl_.b47_ = from._impl_.b47_;
      }
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (from._internal_b48() != 0) {
        _this->_impl_.b48_ = from._impl_.b48_;
      }
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (from._internal_b49() != 0) {
        _this->_impl_.b49_ = from._impl_.b49_;
      }
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (from._internal_b50() != 0) {
        _this->_impl_.b50_ = from._impl_.b50_;
      }
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (from._internal_b51() != 0) {
        _this->_impl_.b51_ = from._impl_.b51_;
      }
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (from._internal_b52() != 0) {
        _this->_impl_.b52_ = from._impl_.b52_;
      }
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (from._internal_b53() != 0) {
        _this->_impl_.b53_ = from._impl_.b53_;
      }
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (from._internal_b54() != 0) {
        _this->_impl_.b54_ = from._impl_.b54_;
      }
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      if (from._internal_b55() != 0) {
        _this->_impl_.b55_ = from._impl_.b55_;
      }
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      if (from._internal_b56() != 0) {
        _this->_impl_.b56_ = from._impl_.b56_;
      }
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      if (from._internal_b57() != 0) {
        _this->_impl_.b57_ = from._impl_.b57_;
      }
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      if (from._internal_b58() != 0) {
        _this->_impl_.b58_ = from._impl_.b58_;
      }
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      if (from._internal_b59() != 0) {
        _this->_impl_.b59_ = from._impl_.b59_;
      }
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      if (from._internal_b60() != 0) {
        _this->_impl_.b60_ = from._impl_.b60_;
      }
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      if (from._internal_b61() != 0) {
        _this->_impl_.b61_ = from._impl_.b61_;
      }
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      if (from._internal_b62() != 0) {
        _this->_impl_.b62_ = from._impl_.b62_;
      }
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      if (from._internal_b63() != 0) {
        _this->_impl_.b63_ = from._impl_.b63_;
      }
    }
  }
  cached_has_bits = from._impl_._has_bits_[2];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (from._internal_b64() != 0) {
        _this->_impl_.b64_ = from._impl_.b64_;
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_b65() != 0) {
        _this->_impl_.b65_ = from._impl_.b65_;
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (from._internal_b66() != 0) {
        _this->_impl_.b66_ = from._impl_.b66_;
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_b67() != 0) {
        _this->_impl_.b67_ = from._impl_.b67_;
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_b68() != 0) {
        _this->_impl_.b68_ = from._impl_.b68_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_b69() != 0) {
        _this->_impl_.b69_ = from._impl_.b69_;
      }
    }
  }
  _this->_impl_._has_bits_.Or(from._impl_._has_bits_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}